

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O3

TableFunctionSet *
duckdb::MultiFileReader::CreateFunctionSet
          (TableFunctionSet *__return_storage_ptr__,TableFunction *table_function)

{
  vector<duckdb::TableFunction,_true> *this;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  reference pvVar4;
  named_parameter_type_map_t *__ht;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  __alloc_node_gen_t __alloc_node_gen;
  undefined8 local_408;
  undefined8 local_400;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3f8;
  LogicalType local_3f0;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  string local_3c0;
  undefined1 local_3a0 [144];
  __buckets_ptr local_310;
  size_type local_308;
  __node_base local_300;
  size_type local_2f8;
  _Prime_rehash_policy local_2f0;
  __node_base_ptr local_2e0;
  undefined1 auStack_2d8 [216];
  element_type *local_200;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8;
  TableFunctionInitialization local_1f0;
  undefined1 local_1e8 [144];
  __buckets_ptr local_158;
  size_type local_150;
  __node_base local_148;
  size_type local_140;
  _Prime_rehash_policy local_138;
  __node_base_ptr local_128;
  undefined1 local_120 [216];
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  TableFunctionInitialization local_38;
  
  pcVar1 = (table_function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
           name._M_dataplus._M_p;
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,pcVar1,
             pcVar1 + (table_function->super_SimpleNamedParameterFunction).super_SimpleFunction.
                      super_Function.name._M_string_length);
  TableFunctionSet::TableFunctionSet(__return_storage_ptr__,&local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  SimpleFunction::SimpleFunction((SimpleFunction *)local_3a0,(SimpleFunction *)table_function);
  local_3a0._0_8_ = &PTR__SimpleNamedParameterFunction_0243ff38;
  local_408 = (__hashtable_alloc *)&local_310;
  __ht = &(table_function->super_SimpleNamedParameterFunction).named_parameters;
  local_310 = (__buckets_ptr)0x0;
  local_308 = (table_function->super_SimpleNamedParameterFunction).named_parameters._M_h.
              _M_bucket_count;
  local_300._M_nxt = (_Hash_node_base *)0x0;
  local_2f8 = (table_function->super_SimpleNamedParameterFunction).named_parameters._M_h.
              _M_element_count;
  local_2f0._M_max_load_factor =
       (table_function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_2f0._4_4_ =
       *(undefined4 *)
        &(table_function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy
         .field_0x4;
  local_2f0._M_next_resize =
       (table_function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_2e0 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_408,&__ht->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)&local_408);
  local_3a0._0_8_ = &PTR__TableFunction_02435168;
  switchD_012b9b0d::default(auStack_2d8,&table_function->bind,0xd6);
  local_200 = (table_function->function_info).internal.
              super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1f8._M_pi =
       (table_function->function_info).internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_1f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1f8._M_pi)->_M_use_count = (local_1f8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1f8._M_pi)->_M_use_count = (local_1f8._M_pi)->_M_use_count + 1;
    }
  }
  local_1f0 = table_function->global_initialization;
  this = &(__return_storage_ptr__->super_FunctionSet<duckdb::TableFunction>).functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&this->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (TableFunction *)local_3a0);
  local_3a0._0_8_ = &PTR__TableFunction_02435168;
  if (local_1f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_3a0);
  LogicalType::LogicalType(&local_3f0,VARCHAR);
  LogicalType::LIST((LogicalType *)&local_408,&local_3f0);
  pvVar4 = vector<duckdb::LogicalType,_true>::operator[]
                     (&(table_function->super_SimpleNamedParameterFunction).super_SimpleFunction.
                       arguments,0);
  _Var3._M_pi = _Stack_3f8._M_pi;
  peVar2 = local_400;
  pvVar4->id_ = (LogicalTypeId)local_408;
  pvVar4->physical_type_ = local_408._1_1_;
  uVar5 = *(undefined4 *)
           &(pvVar4->type_info_).internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar6 = *(undefined4 *)
           ((long)&(pvVar4->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4)
  ;
  uVar7 = *(undefined4 *)
           &(pvVar4->type_info_).internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar8 = *(undefined4 *)
           ((long)&(pvVar4->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi + 4);
  (pvVar4->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (pvVar4->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_400 = (element_type *)0x0;
  _Stack_3f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (pvVar4->type_info_).internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pvVar4->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (pvVar4->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_3d8 = uVar5;
    uStack_3d4 = uVar6;
    uStack_3d0 = uVar7;
    uStack_3cc = uVar8;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    uVar5 = local_3d8;
    uVar6 = uStack_3d4;
    uVar7 = uStack_3d0;
    uVar8 = uStack_3cc;
  }
  _Var3._M_pi = _Stack_3f8._M_pi;
  local_400 = (element_type *)CONCAT44(uVar6,uVar5);
  _Stack_3f8._M_pi._4_4_ = uVar8;
  _Stack_3f8._M_pi._0_4_ = uVar7;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  LogicalType::~LogicalType((LogicalType *)&local_408);
  LogicalType::~LogicalType(&local_3f0);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_1e8,(SimpleFunction *)table_function);
  local_408 = (__hashtable_alloc *)&local_158;
  local_1e8._0_8_ = &PTR__SimpleNamedParameterFunction_0243ff38;
  local_158 = (__buckets_ptr)0x0;
  local_150 = (table_function->super_SimpleNamedParameterFunction).named_parameters._M_h.
              _M_bucket_count;
  local_148._M_nxt = (_Hash_node_base *)0x0;
  local_140 = (table_function->super_SimpleNamedParameterFunction).named_parameters._M_h.
              _M_element_count;
  local_138._M_max_load_factor =
       (table_function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_138._4_4_ =
       *(undefined4 *)
        &(table_function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy
         .field_0x4;
  local_138._M_next_resize =
       (table_function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_128 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_408,&__ht->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)&local_408);
  local_1e8._0_8_ = &PTR__TableFunction_02435168;
  switchD_012b9b0d::default(local_120,&table_function->bind,0xd6);
  local_48 = (table_function->function_info).internal.
             super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Stack_40._M_pi =
       (table_function->function_info).internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (table_function->function_info).internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (table_function->function_info).internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38 = table_function->global_initialization;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&this->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (TableFunction *)local_1e8);
  local_1e8._0_8_ = &PTR__TableFunction_02435168;
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_1e8);
  return __return_storage_ptr__;
}

Assistant:

TableFunctionSet MultiFileReader::CreateFunctionSet(TableFunction table_function) {
	TableFunctionSet function_set(table_function.name);
	function_set.AddFunction(table_function);
	D_ASSERT(!table_function.arguments.empty() && table_function.arguments[0] == LogicalType::VARCHAR);
	table_function.arguments[0] = LogicalType::LIST(LogicalType::VARCHAR);
	function_set.AddFunction(std::move(table_function));
	return function_set;
}